

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O3

path * __thiscall TorController::GetPrivateKeyFile(path *__return_storage_ptr__,TorController *this)

{
  long in_FS_OFFSET;
  path local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir((path *)&local_40,&gArgs,true);
  std::filesystem::__cxx11::path::_M_append(&local_40,0x14,"onion_v3_private_key");
  std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,&local_40);
  std::filesystem::__cxx11::path::~path(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

fs::path TorController::GetPrivateKeyFile()
{
    return gArgs.GetDataDirNet() / "onion_v3_private_key";
}